

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O2

int __thiscall helics::MessageFederateManager::getEndpointCount(MessageFederateManager *this)

{
  size_t sVar1;
  shared_handle local_20;
  
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  ::lock_shared(&local_20,&this->mLocalEndpoints);
  sVar1 = ((local_20.data)->dataStorage).csize;
  std::shared_lock<std::shared_mutex>::~shared_lock(&local_20.m_handle_lock);
  return (int)sVar1;
}

Assistant:

int MessageFederateManager::getEndpointCount() const
{
    return static_cast<int>(mLocalEndpoints.lock_shared()->size());
}